

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

int Wlc_NtkAbsCore(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  Abc_Cex_t *pCex;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Bit_t *vUnmark;
  int *piVar6;
  Vec_Bit_t *pVVar7;
  Wlc_Ntk_t *p_00;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vFlops;
  Gia_Man_t *pGVar9;
  Gia_Man_t *p_01;
  Aig_Man_t *pAig;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  Vec_Int_t **extraout_RDX;
  Vec_Int_t **extraout_RDX_00;
  Vec_Int_t **pvFlops;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  size_t sVar18;
  uint uVar19;
  uint uVar20;
  int level;
  ulong uVar21;
  char *__format;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  Vec_Int_t *vBlacks;
  timespec ts_1;
  Pdr_Par_t PdrPars;
  uint local_13c;
  uint local_138;
  Vec_Int_t *local_118;
  int local_10c;
  long local_108;
  timespec local_100;
  Pdr_Par_t local_f0;
  
  iVar3 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar3 < 0) {
    local_108 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_f0._8_8_),8);
    local_108 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_f0._0_8_ * -1000000;
  }
  local_118 = (Vec_Int_t *)0x0;
  iVar3 = ((p->iObj >> 5) + 1) - (uint)((p->iObj & 0x1fU) == 0);
  vUnmark = (Vec_Bit_t *)malloc(0x10);
  vUnmark->nCap = iVar3 * 0x20;
  if (iVar3 == 0) {
    sVar18 = 0;
    piVar6 = (int *)0x0;
  }
  else {
    sVar18 = (long)iVar3 << 2;
    piVar6 = (int *)malloc(sVar18);
  }
  vUnmark->pArray = piVar6;
  vUnmark->nSize = iVar3 * 0x20;
  memset(piVar6,0,sVar18);
  Pdr_ManSetDefaultParams(&local_f0);
  local_f0.fVerbose = pPars->fPdrVerbose;
  local_f0.fVeryVerbose = 0;
  if (pPars->nIterMax < 2) {
    iVar3 = -1;
    uVar19 = 1;
  }
  else {
    uVar19 = 1;
    do {
      if (pPars->fVerbose != 0) {
        printf("\nIteration %d:\n");
      }
      if (pPars->fAbs2 == 0) {
        if ((uVar19 == 1) && (pPars->nLimit < 1000000000)) {
          pVVar7 = Wlc_NtkMarkLimit(p,pPars);
          uVar5 = pVVar7->nSize;
          if ((int)uVar5 < 1) {
            piVar6 = pVVar7->pArray;
            if (piVar6 != (int *)0x0) goto LAB_00896376;
          }
          else {
            uVar17 = vUnmark->nSize;
            uVar11 = 0;
            if ((int)uVar17 < 1) {
              uVar17 = 0;
              uVar11 = 0;
            }
            do {
              if (uVar17 == uVar11) goto LAB_00896bf2;
              uVar20 = uVar11 >> 5;
              piVar6 = pVVar7->pArray;
              uVar22 = 1 << ((byte)uVar11 & 0x1f);
              if (((uint)piVar6[uVar20] >> (uVar11 & 0x1f) & 1) == 0) {
                vUnmark->pArray[uVar20] = vUnmark->pArray[uVar20] | uVar22;
              }
              else {
                vUnmark->pArray[uVar20] = vUnmark->pArray[uVar20] & ~uVar22;
              }
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
LAB_00896376:
            free(piVar6);
          }
          free(pVVar7);
        }
        local_10c = pPars->fVerbose;
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 100;
        pVVar10->nSize = 0;
        piVar6 = (int *)malloc(400);
        pVVar10->pArray = piVar6;
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 100;
        pVVar8->nSize = 0;
        piVar6 = (int *)malloc(400);
        pVVar8->pArray = piVar6;
        vFlops = (Vec_Int_t *)malloc(0x10);
        vFlops->nCap = 100;
        vFlops->nSize = 0;
        piVar6 = (int *)malloc(400);
        vFlops->pArray = piVar6;
        uVar5 = p->iObj;
        iVar3 = (((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0);
        pVVar7 = (Vec_Bit_t *)malloc(0x10);
        uVar17 = iVar3 * 0x20;
        pVVar7->nCap = uVar17;
        if (iVar3 == 0) {
          sVar18 = 0;
          piVar6 = (int *)0x0;
        }
        else {
          sVar18 = (long)iVar3 << 2;
          piVar6 = (int *)malloc(sVar18);
        }
        pVVar7->pArray = piVar6;
        pVVar7->nSize = uVar17;
        local_138 = 0;
        memset(piVar6,0,sVar18);
        uVar15 = 0;
        local_13c = 0;
        if (1 < (int)uVar5) {
          uVar21 = (ulong)uVar17;
          uVar17 = p->nObjsAlloc;
          if (p->nObjsAlloc < 2) {
            uVar17 = 1;
          }
          uVar12 = 1;
          lVar14 = 0x24;
          local_13c = 0;
          uVar15 = 0;
          local_138 = 0;
          do {
            if (uVar17 == uVar12) goto LAB_00896b76;
            if ((long)vUnmark->nSize <= (long)uVar12) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            uVar23 = uVar12 >> 5 & 0x7ffffff;
            uVar11 = 1 << ((byte)uVar12 & 0x1f);
            if (((uint)vUnmark->pArray[uVar23] >> ((uint)uVar12 & 0x1f) & 1) == 0) {
              pWVar2 = p->pObjs;
              uVar1 = *(ushort *)((long)pWVar2 + lVar14 + -0xc);
              uVar20 = uVar1 & 0x3f;
              uVar24 = (ulong)uVar20;
              if (uVar20 < 0x33) {
                if ((0x1e00000000000U >> uVar24 & 1) == 0) {
                  if ((0x4180000000000U >> uVar24 & 1) == 0) {
                    if (uVar24 != 8) goto LAB_0089660f;
                    iVar4 = *(int *)((long)pWVar2 + lVar14 + -4) -
                            *(int *)(&pWVar2->field_0x0 + lVar14);
                    iVar3 = -iVar4;
                    if (0 < iVar4) {
                      iVar3 = iVar4;
                    }
                    if (pPars->nBitsMux <= iVar3 + 1) {
                      if (uVar21 <= uVar12) goto LAB_00896bf2;
                      piVar6[uVar23] = piVar6[uVar23] | uVar11;
                      local_13c = local_13c + 1;
                    }
                  }
                  else {
                    iVar4 = *(int *)((long)pWVar2 + lVar14 + -4) -
                            *(int *)(&pWVar2->field_0x0 + lVar14);
                    iVar3 = -iVar4;
                    if (0 < iVar4) {
                      iVar3 = iVar4;
                    }
                    if (pPars->nBitsAdd <= iVar3 + 1) {
                      if (uVar21 <= uVar12) goto LAB_00896bf2;
                      piVar6[uVar23] = piVar6[uVar23] | uVar11;
                      local_138 = local_138 + 1;
                    }
                  }
                }
                else {
                  iVar4 = *(int *)((long)pWVar2 + lVar14 + -4) -
                          *(int *)(&pWVar2->field_0x0 + lVar14);
                  iVar3 = -iVar4;
                  if (0 < iVar4) {
                    iVar3 = iVar4;
                  }
                  if (pPars->nBitsMul <= iVar3 + 1) {
                    if (uVar21 <= uVar12) {
LAB_00896bf2:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                    }
                    piVar6[uVar23] = piVar6[uVar23] | uVar11;
                    uVar15 = (ulong)((int)uVar15 + 1);
                  }
                }
              }
              else {
LAB_0089660f:
                if ((short)uVar20 != 1 && (uVar1 & 0x3d) == 1) {
                  iVar4 = *(int *)((long)pWVar2 + lVar14 + -4) -
                          *(int *)(&pWVar2->field_0x0 + lVar14);
                  iVar3 = -iVar4;
                  if (0 < iVar4) {
                    iVar3 = iVar4;
                  }
                  if (pPars->nBitsFlop <= iVar3 + 1) {
                    if (uVar21 <= uVar12) goto LAB_00896bf2;
                    piVar6[uVar23] = piVar6[uVar23] | uVar11;
                  }
                }
              }
            }
            uVar12 = uVar12 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar5 != uVar12);
        }
        if (local_10c != 0) {
          printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
                 ,(ulong)local_138,uVar15,(ulong)local_13c);
        }
        Wlc_NtkCleanMarks(p);
        if ((p->vCos).nSize < 1) {
          iVar3 = 0;
        }
        else {
          lVar14 = 0;
          do {
            iVar3 = (p->vCos).pArray[lVar14];
            if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_00896b76;
            Wlc_NtkAbsMarkNodes_rec(p,p->pObjs + iVar3,pVVar7,pVVar10,pVVar8,vFlops);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (p->vCos).nSize);
          iVar3 = vFlops->nSize;
          if (0 < iVar3) {
            lVar14 = 0;
            do {
              lVar16 = (long)vFlops->pArray[lVar14];
              if ((lVar16 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar14])) goto LAB_00896b76;
              pWVar2 = p->pObjs;
              if ((undefined1  [24])((undefined1  [24])pWVar2[lVar16] & (undefined1  [24])0x3f) !=
                  (undefined1  [24])0x3) {
                __assert_fail("pObj->Type == WLC_OBJ_FO",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                              ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
              }
              uVar5 = (pWVar2[lVar16].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
              if (((int)uVar5 < 0) || ((p->vCos).nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar5 = (p->vCos).pArray[uVar5];
              if (((long)(int)uVar5 < 1) || ((uint)p->nObjsAlloc <= uVar5)) goto LAB_00896b76;
              Wlc_NtkAbsMarkNodes_rec(p,pWVar2 + (int)uVar5,pVVar7,pVVar10,pVVar8,vFlops);
              lVar14 = lVar14 + 1;
              iVar3 = vFlops->nSize;
            } while (lVar14 < iVar3);
          }
        }
        if (1 < p->iObj) {
          iVar4 = p->nObjsAlloc;
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          if (iVar4 - 1U <= p->iObj - 2U) {
LAB_00896b76:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
        }
        qsort(pVVar10->pArray,(long)pVVar10->nSize,4,Vec_IntSortCompare1);
        qsort(pVVar8->pArray,(long)pVVar8->nSize,4,Vec_IntSortCompare1);
        qsort(vFlops->pArray,(long)iVar3,4,Vec_IntSortCompare1);
        Wlc_NtkCleanMarks(p);
        if (piVar6 != (int *)0x0) {
          free(piVar6);
        }
        free(pVVar7);
        p_00 = Wlc_NtkDupDfsAbs(p,pVVar10,pVVar8,vFlops);
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
        }
        free(pVVar10);
        if (vFlops->pArray != (int *)0x0) {
          free(vFlops->pArray);
        }
        free(vFlops);
      }
      else {
        if (local_118 == (Vec_Int_t *)0x0) {
          local_118 = Wlc_NtkGetBlacks(p,pPars);
          pvFlops = extraout_RDX_00;
        }
        else {
          Wlc_NtkUpdateBlacks(p,pPars,&local_118,vUnmark,(Vec_Int_t *)0x0);
          pvFlops = extraout_RDX;
        }
        pVVar10 = local_118;
        p_00 = Wlc_NtkAbs2(p,local_118,pvFlops);
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        iVar3 = pVVar10->nSize;
        pVVar8->nSize = iVar3;
        pVVar8->nCap = iVar3;
        if ((long)iVar3 == 0) {
          sVar18 = 0;
          piVar6 = (int *)0x0;
        }
        else {
          sVar18 = (long)iVar3 << 2;
          piVar6 = (int *)malloc(sVar18);
        }
        pVVar8->pArray = piVar6;
        memcpy(piVar6,pVVar10->pArray,sVar18);
      }
      pGVar9 = Wlc_NtkBitBlast(p_00,(Wlc_BstPar_t *)0x0);
      iVar3 = Wlc_NtkDcFlopNum(p_00);
      p_01 = pGVar9;
      if (0 < iVar3) {
        iVar4 = Wlc_NtkCountObjBits(p,pVVar8);
        p_01 = Gia_ManPermuteInputs(pGVar9,iVar4,iVar3);
        Gia_ManStop(pGVar9);
      }
      pGVar9 = p_01;
      if (pPars->fXorOutput != 0) {
        pGVar9 = Gia_ManTransformMiter2(p_01);
        Gia_ManStop(p_01);
      }
      if (pPars->fVerbose != 0) {
        printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
               (ulong)(p_00->iObj - 1),(ulong)(uint)pVVar8->nSize);
        Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
      }
      Wlc_NtkFree(p_00);
      pAig = Gia_ManToAigSimple(pGVar9);
      iVar3 = Pdr_ManSolve(pAig,&local_f0);
      pCex = pAig->pSeqModel;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(pAig);
      if (pCex == (Abc_Cex_t *)0x0) {
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                        ,0x74a,"int Wlc_NtkAbsCore(Wlc_Ntk_t *, Wlc_Par_t *)");
        }
        Gia_ManStop(pGVar9);
        if (pVVar8->pArray != (int *)0x0) {
          free(pVVar8->pArray);
        }
        free(pVVar8);
        break;
      }
      pVVar10 = Wlc_NtkAbsRefinement(p,pGVar9,pCex,pVVar8);
      Gia_ManStop(pGVar9);
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      if (pVVar10 == (Vec_Int_t *)0x0) {
        Abc_CexFree(pCex);
        break;
      }
      uVar5 = Wlc_NtkRemoveFromAbstraction(p,pVVar10,vUnmark);
      if (pPars->fVerbose != 0) {
        printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
               ,(ulong)(uint)pCex->iFrame,(ulong)(uint)pVVar10->nSize,(ulong)uVar5);
      }
      if (pVVar10->pArray != (int *)0x0) {
        free(pVVar10->pArray);
      }
      free(pVVar10);
      Abc_CexFree(pCex);
      uVar19 = uVar19 + 1;
    } while ((int)uVar19 < pPars->nIterMax);
  }
  pVVar8 = local_118;
  if (local_118->pArray != (int *)0x0) {
    free(local_118->pArray);
  }
  free(pVVar8);
  if (vUnmark->pArray != (int *)0x0) {
    free(vUnmark->pArray);
  }
  free(vUnmark);
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar13 = "timed out";
  if (iVar3 == 1) {
    pcVar13 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (iVar3 != 0) {
    __format = pcVar13;
  }
  printf(__format);
  printf(" after %d iterations. ",(ulong)uVar19);
  level = 3;
  iVar4 = clock_gettime(3,&local_100);
  if (iVar4 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
  }
  lVar14 = lVar14 + local_108;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  return iVar3;
}

Assistant:

int Wlc_NtkAbsCore( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vBlacks = NULL;
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    //pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    //pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    pPdrPars->fVeryVerbose = 0;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        if ( pPars->fAbs2 )
        {
            if ( vBlacks == NULL )
                vBlacks = Wlc_NtkGetBlacks( p, pPars );
            else
                Wlc_NtkUpdateBlacks( p, pPars, &vBlacks, vUnmark, NULL );
            pAbs = Wlc_NtkAbs2( p, vBlacks, NULL );
            vPisNew = Vec_IntDup( vBlacks );
        }
        else
        {
            if ( nIters == 1 && pPars->nLimit < ABC_INFINITY )
                Wlc_NtkSetUnmark( p, pPars, vUnmark );

            pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, NULL, pPars->fVerbose );
        }
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_IntFree( vBlacks );
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}